

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O0

UndoBufferReference * __thiscall
duckdb::UndoBufferAllocator::Allocate(UndoBufferAllocator *this,idx_t alloc_len)

{
  long *plVar1;
  bool bVar2;
  ulong uVar3;
  pointer pUVar4;
  pointer handle_p;
  type this_00;
  idx_t in_RDX;
  long *in_RSI;
  UndoBufferReference *in_RDI;
  idx_t current_position;
  templated_unique_single_t entry;
  idx_t capacity;
  idx_t block_size;
  BufferHandle handle;
  BufferHandle *in_stack_fffffffffffffe38;
  BufferHandle *in_stack_fffffffffffffe40;
  shared_ptr<duckdb::BlockHandle,_true> *in_stack_fffffffffffffe48;
  BufferHandle *in_stack_fffffffffffffe50;
  shared_ptr<duckdb::BlockHandle,_true> *in_stack_fffffffffffffe58;
  UndoBufferReference *in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe88;
  BufferHandle local_e0;
  idx_t local_c8;
  undefined1 local_c0 [24];
  optional_ptr<duckdb::UndoBufferEntry,_true> local_a8;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  ulong local_50;
  ulong local_48;
  BufferHandle local_30;
  idx_t local_18;
  
  local_18 = in_RDX;
  BufferHandle::BufferHandle(in_stack_fffffffffffffe50);
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                      *)0xcbf2f0);
  if (bVar2) {
    pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)in_stack_fffffffffffffe40);
    uVar3 = pUVar4->position + local_18;
    pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)in_stack_fffffffffffffe40);
    if (uVar3 <= pUVar4->capacity) {
      in_stack_fffffffffffffe60 = (UndoBufferReference *)*in_RSI;
      pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                             *)in_stack_fffffffffffffe40);
      (*(code *)(in_stack_fffffffffffffe60->entry).ptr[1].buffer_manager)
                (local_c0,in_stack_fffffffffffffe60,&pUVar4->block);
      BufferHandle::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      BufferHandle::~BufferHandle(in_stack_fffffffffffffe40);
      goto LAB_00cbf7d1;
    }
  }
  local_48 = (**(code **)(*(long *)*in_RSI + 0x78))();
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                      *)0xcbf3a4);
  if ((bVar2) || (0x1000 < local_18)) {
    local_50 = local_48;
  }
  else {
    local_50 = 0x1000;
  }
  if (local_50 < local_18) {
    local_50 = NextPowerOfTwo(in_stack_fffffffffffffe88);
  }
  make_uniq<duckdb::UndoBufferEntry,duckdb::BufferManager&>
            ((BufferManager *)in_stack_fffffffffffffe58);
  if (local_50 < local_48) {
    (**(code **)(*(long *)*in_RSI + 0x98))(local_68,(long *)*in_RSI,0xc,local_50);
    unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
    operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                *)in_stack_fffffffffffffe40);
    shared_ptr<duckdb::BlockHandle,_true>::operator=
              (&in_stack_fffffffffffffe50->handle,in_stack_fffffffffffffe48);
    shared_ptr<duckdb::BlockHandle,_true>::~shared_ptr
              ((shared_ptr<duckdb::BlockHandle,_true> *)0xcbf4c9);
    plVar1 = (long *)*in_RSI;
    pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)in_stack_fffffffffffffe40);
    (**(code **)(*plVar1 + 0x38))(local_80,plVar1,&pUVar4->block);
    BufferHandle::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    BufferHandle::~BufferHandle(in_stack_fffffffffffffe40);
  }
  else {
    (**(code **)(*(long *)*in_RSI + 0x20))(local_98,(long *)*in_RSI,0xc,local_50,0);
    BufferHandle::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    BufferHandle::~BufferHandle(in_stack_fffffffffffffe40);
    BufferHandle::GetBlockHandle(&local_30);
    unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
    operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                *)in_stack_fffffffffffffe40);
    shared_ptr<duckdb::BlockHandle,_true>::operator=
              (in_stack_fffffffffffffe58,&in_stack_fffffffffffffe50->handle);
  }
  uVar3 = local_50;
  pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                       *)in_stack_fffffffffffffe40);
  pUVar4->capacity = uVar3;
  pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                       *)in_stack_fffffffffffffe40);
  pUVar4->position = 0;
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                      *)0xcbf676);
  if (bVar2) {
    pUVar4 = ::std::
             unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::get
                       ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                         *)in_stack_fffffffffffffe40);
    optional_ptr<duckdb::UndoBufferEntry,_true>::optional_ptr(&local_a0,pUVar4);
    pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)in_stack_fffffffffffffe40);
    (pUVar4->prev).ptr = local_a0.ptr;
    unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
    operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                *)in_stack_fffffffffffffe40);
    unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
    operator=((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               *)in_stack_fffffffffffffe40,
              (unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               *)in_stack_fffffffffffffe38);
  }
  else {
    pUVar4 = ::std::
             unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::get
                       ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                         *)in_stack_fffffffffffffe40);
    optional_ptr<duckdb::UndoBufferEntry,_true>::optional_ptr(&local_a8,pUVar4);
    in_RSI[2] = (long)local_a8.ptr;
  }
  unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::operator=
            ((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
              *)in_stack_fffffffffffffe40,
             (unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
              *)in_stack_fffffffffffffe38);
  unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
  ~unique_ptr((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               *)0xcbf75a);
LAB_00cbf7d1:
  pUVar4 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                       *)in_stack_fffffffffffffe40);
  local_c8 = pUVar4->position;
  handle_p = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                           *)in_stack_fffffffffffffe40);
  handle_p->position = handle_p->position + local_18;
  this_00 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
            ::operator*((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                         *)in_stack_fffffffffffffe40);
  BufferHandle::BufferHandle((BufferHandle *)this_00,&local_e0);
  UndoBufferReference::UndoBufferReference
            (in_stack_fffffffffffffe60,pUVar4,(BufferHandle *)handle_p,local_18);
  BufferHandle::~BufferHandle((BufferHandle *)this_00);
  BufferHandle::~BufferHandle((BufferHandle *)this_00);
  return in_RDI;
}

Assistant:

UndoBufferReference UndoBufferAllocator::Allocate(idx_t alloc_len) {
	D_ASSERT(!head || head->position <= head->capacity);
	BufferHandle handle;
	if (!head || head->position + alloc_len > head->capacity) {
		// no space in current head - allocate a new block
		auto block_size = buffer_manager.GetBlockSize();
		;
		idx_t capacity;
		if (!head && alloc_len <= 4096) {
			capacity = 4096;
		} else {
			capacity = block_size;
		}
		if (capacity < alloc_len) {
			capacity = NextPowerOfTwo(alloc_len);
		}
		auto entry = make_uniq<UndoBufferEntry>(buffer_manager);
		if (capacity < block_size) {
			entry->block = buffer_manager.RegisterSmallMemory(MemoryTag::TRANSACTION, capacity);
			handle = buffer_manager.Pin(entry->block);
		} else {
			handle = buffer_manager.Allocate(MemoryTag::TRANSACTION, capacity, false);
			entry->block = handle.GetBlockHandle();
		}
		entry->capacity = capacity;
		entry->position = 0;
		// add block to the chain
		if (head) {
			head->prev = entry.get();
			entry->next = std::move(head);
		} else {
			tail = entry.get();
		}
		head = std::move(entry);
	} else {
		handle = buffer_manager.Pin(head->block);
	}
	idx_t current_position = head->position;
	head->position += alloc_len;
	return UndoBufferReference(*head, std::move(handle), current_position);
}